

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O3

ValueInfo * __thiscall ValueInfo::Copy(ValueInfo *this,JitArenaAllocator *allocator)

{
  ValueType *this_00;
  ValueStructureKind *pVVar1;
  bool bVar2;
  ValueInfo *pVVar3;
  IntBoundedValueInfo *pIVar4;
  JsTypeValueInfo *pJVar5;
  
  this_00 = &this->super_ValueType;
  bVar2 = ValueType::IsInt(this_00);
  pVVar1 = &this->structureKind;
  if ((bVar2) && (this->structureKind == IntConstant)) {
    AsIntConstant(this);
    pVVar3 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
    (pVVar3->super_ValueType).field_0 = (this->super_ValueType).field_0;
    pVVar3->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014d5218;
    *(undefined4 *)((long)&pVVar3->symStore + 4) = *(undefined4 *)((long)&this->symStore + 4);
    *(undefined8 *)&pVVar3->structureKind = *(undefined8 *)pVVar1;
    *(undefined4 *)&pVVar3[1]._vptr_ValueInfo = *(undefined4 *)&this[1]._vptr_ValueInfo;
    pVVar3->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014d52a8;
  }
  else {
    bVar2 = ValueType::IsInt(this_00);
    if ((bVar2) && (*pVVar1 == IntRange)) {
      AsIntRange(this);
      pVVar3 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x28,allocator,0x3eba5c);
      (pVVar3->super_ValueType).field_0 = (this->super_ValueType).field_0;
      pVVar3->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014d5218;
      *(undefined4 *)((long)&pVVar3->symStore + 4) = *(undefined4 *)((long)&this->symStore + 4);
      *(undefined8 *)&pVVar3->structureKind = *(undefined8 *)pVVar1;
      pVVar3[1]._vptr_ValueInfo = this[1]._vptr_ValueInfo;
      pVVar3->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014d5308;
      *(undefined1 *)&pVVar3[1].super_ValueType.field_0 =
           *(undefined1 *)&this[1].super_ValueType.field_0;
    }
    else {
      bVar2 = IsIntBounded(this);
      if (bVar2) {
        AsIntBounded(this);
        pIVar4 = IntBoundedValueInfo::Copy((IntBoundedValueInfo *)this,allocator);
        return &pIVar4->super_ValueInfo;
      }
      bVar2 = ValueType::IsFloat(this_00);
      if ((!bVar2) || (*pVVar1 != FloatConstant)) {
        bVar2 = IsJsType(this);
        if (bVar2) {
          AsJsType(this);
          pJVar5 = JsTypeValueInfo::Copy((JsTypeValueInfo *)this,allocator);
          return &pJVar5->super_ValueInfo;
        }
        bVar2 = ValueType::IsAnyOptimizedArray(this_00);
        if ((bVar2) && (*pVVar1 == Array)) {
          AsArrayValueInfo(this);
          pVVar3 = ArrayValueInfo::Copy((ArrayValueInfo *)this,allocator,true,true,true);
          return pVVar3;
        }
        pVVar3 = CopyWithGenericStructureKind(this,allocator);
        return pVVar3;
      }
      AsFloatConstant(this);
      pVVar3 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
      (pVVar3->super_ValueType).field_0 = (this->super_ValueType).field_0;
      pVVar3->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014d5218;
      *(undefined4 *)((long)&pVVar3->symStore + 4) = *(undefined4 *)((long)&this->symStore + 4);
      *(undefined8 *)&pVVar3->structureKind = *(undefined8 *)pVVar1;
      pVVar3->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014d5368;
      pVVar3[1]._vptr_ValueInfo = this[1]._vptr_ValueInfo;
    }
  }
  return pVVar3;
}

Assistant:

ValueInfo *
ValueInfo::Copy(JitArenaAllocator * allocator)
{
    if (IsIntConstant())
    {
        return AsIntConstant()->Copy(allocator);
    }
    if (IsIntRange())
    {
        return AsIntRange()->Copy(allocator);
    }
    if (IsIntBounded())
    {
        return AsIntBounded()->Copy(allocator);
    }
    if (IsFloatConstant())
    {
        return AsFloatConstant()->Copy(allocator);
    }
    if (IsJsType())
    {
        return AsJsType()->Copy(allocator);
    }
    if (IsArrayValueInfo())
    {
        return AsArrayValueInfo()->Copy(allocator);
    }
    return CopyWithGenericStructureKind(allocator);
}